

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkCreatePropertyMonitorTest(Abc_Ntk_t *p)

{
  Vec_Int_t *p_00;
  int *piVar1;
  Vec_Int_t *p_01;
  Abc_Ntk_t *pAVar2;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar1 = (int *)malloc(400);
  p_00->pArray = piVar1;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar1 = (int *)malloc(400);
  p_01->pArray = piVar1;
  Vec_IntPush(p_00,0x5a);
  Vec_IntPush(p_00,0x50);
  Vec_IntPush(p_00,100);
  Vec_IntPush(p_01,1);
  Vec_IntPush(p_01,0);
  Vec_IntPush(p_01,1);
  pAVar2 = Abc_NtkCreatePropertyMonitor(p,p_00,p_01);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  return pAVar2;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreatePropertyMonitorTest( Abc_Ntk_t * p )
{
    Abc_Ntk_t * pNtk;
    Vec_Int_t * vNodeIds = Vec_IntAlloc( 100 );
    Vec_Int_t * vNodeValues = Vec_IntAlloc( 100 );

    // this test will only work for the network, which has nodes with internal IDs such as these
    Vec_IntPush( vNodeIds, 90 );
    Vec_IntPush( vNodeIds, 80 );
    Vec_IntPush( vNodeIds, 100 );

    Vec_IntPush( vNodeValues, 1 );
    Vec_IntPush( vNodeValues, 0 );
    Vec_IntPush( vNodeValues, 1 );

    pNtk = Abc_NtkCreatePropertyMonitor( p, vNodeIds, vNodeValues );

    Vec_IntFree( vNodeIds );
    Vec_IntFree( vNodeValues );

    return pNtk;
}